

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

void __thiscall
Diligent::LogicOperationToVkLogicOp::LogicOperationToVkLogicOp(LogicOperationToVkLogicOp *this)

{
  (this->m_Map)._M_elems[0] = VK_LOGIC_OP_CLEAR;
  (this->m_Map)._M_elems[1] = VK_LOGIC_OP_SET;
  (this->m_Map)._M_elems[2] = VK_LOGIC_OP_COPY;
  (this->m_Map)._M_elems[3] = VK_LOGIC_OP_COPY_INVERTED;
  (this->m_Map)._M_elems[4] = VK_LOGIC_OP_NO_OP;
  (this->m_Map)._M_elems[5] = VK_LOGIC_OP_INVERT;
  (this->m_Map)._M_elems[6] = VK_LOGIC_OP_AND;
  (this->m_Map)._M_elems[7] = VK_LOGIC_OP_NAND;
  (this->m_Map)._M_elems[8] = VK_LOGIC_OP_OR;
  (this->m_Map)._M_elems[9] = VK_LOGIC_OP_NOR;
  (this->m_Map)._M_elems[10] = VK_LOGIC_OP_XOR;
  (this->m_Map)._M_elems[0xb] = VK_LOGIC_OP_EQUIVALENT;
  (this->m_Map)._M_elems[0xc] = VK_LOGIC_OP_AND_REVERSE;
  (this->m_Map)._M_elems[0xd] = VK_LOGIC_OP_AND_INVERTED;
  (this->m_Map)._M_elems[0xe] = VK_LOGIC_OP_OR_REVERSE;
  (this->m_Map)._M_elems[0xf] = VK_LOGIC_OP_OR_INVERTED;
  return;
}

Assistant:

LogicOperationToVkLogicOp()
    {
        m_Map[LOGIC_OP_CLEAR]         = VK_LOGIC_OP_CLEAR;
        m_Map[LOGIC_OP_SET]           = VK_LOGIC_OP_SET;
        m_Map[LOGIC_OP_COPY]          = VK_LOGIC_OP_COPY;
        m_Map[LOGIC_OP_COPY_INVERTED] = VK_LOGIC_OP_COPY_INVERTED;
        m_Map[LOGIC_OP_NOOP]          = VK_LOGIC_OP_NO_OP;
        m_Map[LOGIC_OP_INVERT]        = VK_LOGIC_OP_INVERT;
        m_Map[LOGIC_OP_AND]           = VK_LOGIC_OP_AND;
        m_Map[LOGIC_OP_NAND]          = VK_LOGIC_OP_NAND;
        m_Map[LOGIC_OP_OR]            = VK_LOGIC_OP_OR;
        m_Map[LOGIC_OP_NOR]           = VK_LOGIC_OP_NOR;
        m_Map[LOGIC_OP_XOR]           = VK_LOGIC_OP_XOR;
        m_Map[LOGIC_OP_EQUIV]         = VK_LOGIC_OP_EQUIVALENT;
        m_Map[LOGIC_OP_AND_REVERSE]   = VK_LOGIC_OP_AND_REVERSE;
        m_Map[LOGIC_OP_AND_INVERTED]  = VK_LOGIC_OP_AND_INVERTED;
        m_Map[LOGIC_OP_OR_REVERSE]    = VK_LOGIC_OP_OR_REVERSE;
        m_Map[LOGIC_OP_OR_INVERTED]   = VK_LOGIC_OP_OR_INVERTED;
    }